

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_manager.cpp
# Opt level: O2

vector<duckdb::TemporaryFileInformation,_true> * __thiscall
duckdb::BufferManager::GetTemporaryFiles
          (vector<duckdb::TemporaryFileInformation,_true> *__return_storage_ptr__,
          BufferManager *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"This type of BufferManager does not allow temporary files",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<TemporaryFileInformation> BufferManager::GetTemporaryFiles() {
	throw InternalException("This type of BufferManager does not allow temporary files");
}